

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comm.cpp
# Opt level: O3

string * __thiscall
banksia::formatPeriod_abi_cxx11_(string *__return_storage_ptr__,banksia *this,int seconds)

{
  ostream *poVar1;
  long *plVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  ostream *poVar6;
  long lVar7;
  ostringstream stringStream;
  ostringstream local_1a0 [112];
  ios_base local_130 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  iVar4 = (int)this;
  if (0x1517f < iVar4) {
    poVar1 = (ostream *)
             std::ostream::operator<<
                       (local_1a0,(uint)(ushort)(((ulong)this & 0xffffffff) / 0x15180));
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"d ",2);
  }
  iVar5 = iVar4 / 0xe10;
  iVar5 = iVar5 + (((uint)(iVar5 / 6 + (iVar5 >> 0x1f)) >> 2) - (iVar5 >> 0x1f)) * -0x18;
  if (0 < iVar5) {
    poVar1 = (ostream *)std::ostream::operator<<(local_1a0,iVar5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,":",1);
    lVar3 = *(long *)poVar1;
    poVar6 = poVar1 + *(long *)(lVar3 + -0x18);
    if (poVar1[*(long *)(lVar3 + -0x18) + 0xe1] == (ostream)0x0) {
      std::ios::widen((char)poVar6);
      poVar6[0xe1] = (ostream)0x1;
      lVar3 = *(long *)poVar1;
    }
    poVar6[0xe0] = (ostream)0x30;
    *(undefined8 *)(poVar1 + *(long *)(lVar3 + -0x18) + 0x10) = 2;
  }
  poVar1 = (ostream *)std::ostream::operator<<(local_1a0,(iVar4 / 0x3c) % 0x3c);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,":",1);
  lVar3 = *(long *)poVar1;
  poVar6 = poVar1 + *(long *)(lVar3 + -0x18);
  if (poVar1[*(long *)(lVar3 + -0x18) + 0xe1] == (ostream)0x0) {
    std::ios::widen((char)poVar6);
    poVar6[0xe1] = (ostream)0x1;
    lVar3 = *(long *)poVar1;
  }
  poVar6[0xe0] = (ostream)0x30;
  *(undefined8 *)(poVar1 + *(long *)(lVar3 + -0x18) + 0x10) = 2;
  plVar2 = (long *)std::ostream::operator<<(poVar1,iVar4 % 0x3c);
  lVar3 = *plVar2;
  lVar7 = (long)plVar2 + *(long *)(lVar3 + -0x18);
  if (*(char *)((long)plVar2 + *(long *)(lVar3 + -0x18) + 0xe1) == '\0') {
    std::ios::widen((char)lVar7);
    *(undefined1 *)(lVar7 + 0xe1) = 1;
    lVar3 = *plVar2;
  }
  *(undefined1 *)(lVar7 + 0xe0) = 0x20;
  *(undefined8 *)((long)plVar2 + *(long *)(lVar3 + -0x18) + 0x10) = 0;
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  std::ios_base::~ios_base(local_130);
  return __return_storage_ptr__;
}

Assistant:

std::string formatPeriod(int seconds)
    {
        int s = seconds % 60, minutes = seconds / 60, m = minutes % 60, hours = minutes / 60, h = hours % 24, d = hours / 24;
        
        std::ostringstream stringStream;
        if (d > 0) {
            stringStream << d << "d ";
        }
        if (h > 0) {
            stringStream << h << ":"
            << std::setfill('0') << std::setw(2);
        }
        
        stringStream
        << m << ":"
        << std::setfill('0') << std::setw(2)
        << s
        << std::setfill(' ') << std::setw(0);
        return stringStream.str();
    }